

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

bool __thiscall dap::json::JsonCppSerializer::serialize(JsonCppSerializer *this,any *v)

{
  bool bVar1;
  int iVar2;
  boolean *this_00;
  integer *this_01;
  int64_t value_00;
  number *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
  *puVar3;
  TypeInfo *pTVar4;
  void *pvVar5;
  double value_02;
  void *value;
  TypeInfo *type;
  Value local_98;
  Value local_70;
  Value local_48;
  any *local_20;
  any *v_local;
  JsonCppSerializer *this_local;
  
  local_20 = v;
  v_local = (any *)this;
  bVar1 = any::is<dap::boolean>(v);
  if (bVar1) {
    this_00 = any::get<dap::boolean>(local_20);
    bVar1 = boolean::operator_cast_to_bool(this_00);
    Json::Value::Value(&local_48,bVar1);
    Json::Value::operator=(this->json,&local_48);
    Json::Value::~Value(&local_48);
  }
  else {
    bVar1 = any::is<dap::integer>(local_20);
    if (bVar1) {
      this_01 = any::get<dap::integer>(local_20);
      value_00 = integer::operator_cast_to_long(this_01);
      Json::Value::Value(&local_70,value_00);
      Json::Value::operator=(this->json,&local_70);
      Json::Value::~Value(&local_70);
    }
    else {
      bVar1 = any::is<dap::number>(local_20);
      if (bVar1) {
        this_02 = any::get<dap::number>(local_20);
        value_02 = number::operator_cast_to_double(this_02);
        Json::Value::Value(&local_98,value_02);
        Json::Value::operator=(this->json,&local_98);
        Json::Value::~Value(&local_98);
      }
      else {
        bVar1 = any::is<std::__cxx11::string>(local_20);
        if (bVar1) {
          value_01 = any::get<std::__cxx11::string>(local_20);
          Json::Value::Value((Value *)&type,value_01);
          Json::Value::operator=(this->json,(Value *)&type);
          Json::Value::~Value((Value *)&type);
        }
        else {
          bVar1 = any::
                  is<std::unordered_map<std::__cxx11::string,dap::any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>>>
                            (local_20);
          if (bVar1) {
            puVar3 = any::
                     get<std::unordered_map<std::__cxx11::string,dap::any,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>>>
                               (local_20);
            iVar2 = (*(this->super_Serializer)._vptr_Serializer[6])(this,puVar3);
            return (bool)((byte)iVar2 & 1);
          }
          bVar1 = any::is<decltype(nullptr)>(local_20);
          if (!bVar1) {
            pTVar4 = Serializer::get_any_type(local_20);
            pvVar5 = Serializer::get_any_val(local_20);
            if ((pTVar4 != (TypeInfo *)0x0) && (pvVar5 != (void *)0x0)) {
              iVar2 = (*pTVar4->_vptr_TypeInfo[9])(pTVar4,this,pvVar5);
              return (bool)((byte)iVar2 & 1);
            }
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool JsonCppSerializer::serialize(const dap::any& v) {
  if (v.is<dap::boolean>()) {
    *json = (bool)v.get<dap::boolean>();
  } else if (v.is<dap::integer>()) {
    *json = (Json::LargestInt)v.get<dap::integer>();
  } else if (v.is<dap::number>()) {
    *json = (double)v.get<dap::number>();
  } else if (v.is<dap::string>()) {
    *json = v.get<dap::string>();
  } else if (v.is<dap::object>()) {
    // reachable if dap::object nested is inside other dap::object
    return serialize(v.get<dap::object>());
  } else if (v.is<dap::null>()) {
  } else {
    // reachable if array or custom serialized type is nested inside other
    auto type = get_any_type(v);
    auto value = get_any_val(v);
    if (type && value) {
      return type->serialize(this, value);
    }
    return false;
  }
  return true;
}